

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O1

void __thiscall sptk::reaper::EpochTracker::CleanUp(EpochTracker *this)

{
  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
  *this_00;
  pointer pRVar1;
  pointer pTVar2;
  pointer pfVar3;
  pointer ppEVar4;
  ulong uVar5;
  pointer __pos;
  ulong uVar6;
  
  this_00 = &this->resid_peaks_;
  __pos = (this->resid_peaks_).
          super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if ((this->resid_peaks_).
      super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
      ._M_impl.super__Vector_impl_data._M_finish != __pos) {
    uVar6 = 0;
    do {
      pRVar1 = (this_00->
               super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppEVar4 = *(pointer *)
                 &pRVar1[uVar6].future.
                  super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                  ._M_impl;
      if (*(pointer *)
           ((long)&pRVar1[uVar6].future.
                   super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                   ._M_impl + 8) != ppEVar4) {
        uVar5 = 0;
        do {
          if (ppEVar4[uVar5] != (EpochCand *)0x0) {
            operator_delete(ppEVar4[uVar5]);
          }
          uVar5 = uVar5 + 1;
          pRVar1 = (this_00->
                   super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          ppEVar4 = *(pointer *)
                     &pRVar1[uVar6].future.
                      super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                      ._M_impl;
        } while (uVar5 < (ulong)((long)*(pointer *)
                                        ((long)&pRVar1[uVar6].future.
                                                super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                                                ._M_impl + 8) - (long)ppEVar4 >> 3));
      }
      uVar6 = uVar6 + 1;
      __pos = (this->resid_peaks_).
              super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
              ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)(((long)(this->resid_peaks_).
                                    super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)__pos >> 4) *
                            0x6db6db6db6db6db7));
  }
  std::
  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
  ::_M_erase_at_end(this_00,__pos);
  pTVar2 = (this->output_).
           super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->output_).
      super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
      ._M_impl.super__Vector_impl_data._M_finish != pTVar2) {
    (this->output_).
    super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar2;
  }
  pfVar3 = (this->best_corr_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->best_corr_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar3) {
    (this->best_corr_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar3;
  }
  return;
}

Assistant:

void EpochTracker::CleanUp(void) {
  for (size_t i = 0; i < resid_peaks_.size(); ++i) {
    for (size_t j = 0; j < resid_peaks_[i].future.size(); ++j) {
      delete resid_peaks_[i].future[j];
    }
  }
  resid_peaks_.clear();
  output_.clear();
  best_corr_.clear();
}